

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
std::
vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>>>
::emplace_back<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>const&>
          (vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>>>
           *this,CharClass<wchar_t> *__args,set<int,_std::less<int>,_std::allocator<int>_> *__args_1
          )

{
  iterator __position;
  set<int,_std::less<int>,_std::allocator<int>_> *__args_local_1;
  CharClass<wchar_t> *__args_local;
  vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    __position = vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::end((vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)this);
    _M_realloc_insert<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>const&>
              (this,__position,__args,__args_1);
  }
  else {
    allocator_traits<std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>>>
    ::
    construct<std::pair<Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>>,Centaurus::CharClass<wchar_t>,std::set<int,std::less<int>,std::allocator<int>>const&>
              ((allocator_type *)this,
               *(pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                 **)(this + 8),__args,__args_1);
    *(long *)(this + 8) = *(long *)(this + 8) + 0x50;
  }
  return;
}

Assistant:

CharClass(const Range<TCHAR>& r)
    {
        m_ranges.push_back(r);
    }